

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> *
embd_to_audio(vector<float,_std::allocator<float>_> *__return_storage_ptr__,float *embd,int n_codes,
             int n_embd,int n_thread)

{
  double dVar1;
  void *__s;
  ulong uVar2;
  vector<float,_std::allocator<float>_> *extraout_RAX;
  vector<float,_std::allocator<float>_> *extraout_RAX_00;
  vector<float,_std::allocator<float>_> *extraout_RAX_01;
  vector<float,_std::allocator<float>_> *extraout_RAX_02;
  vector<float,_std::allocator<float>_> *extraout_RAX_03;
  vector<float,_std::allocator<float>_> *extraout_RAX_04;
  vector<float,_std::allocator<float>_> *extraout_RAX_05;
  vector<float,_std::allocator<float>_> *pvVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  int i;
  long lVar9;
  pointer pfVar10;
  pointer pfVar11;
  pointer pfVar12;
  undefined4 in_register_00000084;
  ulong n_pad;
  vector<float,_std::allocator<float>_> *in_R9;
  ulong uVar13;
  value_type_conflict5 *__val;
  size_type __n;
  int iVar14;
  float fVar15;
  vector<float,_std::allocator<float>_> env;
  vector<float,_std::allocator<float>_> S;
  vector<float,_std::allocator<float>_> hann2;
  vector<float,_std::allocator<float>_> res;
  vector<float,_std::allocator<float>_> ST;
  vector<float,_std::allocator<float>_> E;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  int local_11c;
  uint local_118;
  uint local_114;
  float local_110;
  float local_10c;
  long *local_108;
  undefined8 uStack_100;
  long local_f8;
  vector<float,_std::allocator<float>_> *local_f0;
  int local_e4;
  thread local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  void *local_78;
  long local_70;
  long local_68;
  vector<float,_std::allocator<float>_> local_60;
  vector<std::thread,_std::allocator<std::thread>_> local_48;
  
  n_pad = CONCAT44(in_register_00000084,n_thread);
  local_e4 = n_codes * 0x140;
  local_11c = n_thread;
  local_118 = n_codes;
  local_114 = n_embd;
  local_f0 = __return_storage_ptr__;
  __s = operator_new(0x1400);
  lVar9 = 0;
  local_78 = __s;
  local_68 = (long)__s + 0x1400;
  memset(__s,0,0x1400);
  local_70 = (long)__s + 0x1400;
  do {
    fVar15 = cosf(((float)(int)lVar9 * 6.2831855) / 1280.0);
    *(float *)((long)__s + lVar9 * 4) = (1.0 - fVar15) * 0.5;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x500);
  __n = (size_type)(n_codes * n_embd);
  std::vector<float,_std::allocator<float>_>::vector(&local_60,__n,(allocator_type *)&local_d8);
  std::vector<float,_std::allocator<float>_>::vector(&local_d8,__n,(allocator_type *)&local_90);
  std::vector<float,_std::allocator<float>_>::vector(&local_90,__n,(allocator_type *)&local_a8);
  uVar2 = (ulong)(int)local_118;
  uVar6 = (ulong)local_114;
  if (0 < (long)uVar2) {
    n_pad = 0;
    pvVar3 = (vector<float,_std::allocator<float>_> *)
             local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (0 < (int)local_114) {
        uVar13 = 0;
        in_R9 = pvVar3;
        do {
          *(float *)&(in_R9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start = embd[uVar13];
          uVar13 = uVar13 + 1;
          in_R9 = (vector<float,_std::allocator<float>_> *)
                  ((long)&(in_R9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + uVar2 * 4);
        } while (uVar6 != uVar13);
      }
      n_pad = n_pad + 1;
      embd = embd + uVar6;
      pvVar3 = (vector<float,_std::allocator<float>_> *)
               ((long)&(pvVar3->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start + 4);
    } while (n_pad != uVar2);
  }
  if ((int)local_114 < 2) {
    uVar7 = (int)local_114 / 2;
    uVar5 = local_118;
    uVar4 = local_114;
  }
  else {
    iVar14 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar9 = 0;
        do {
          local_10c = *(float *)((long)&(((_Vector_base<float,_std::allocator<float>_> *)
                                         local_60.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                        super__Vector_impl_data._M_start +
                                (((int)local_114 / 2 + iVar14) * (int)uVar2 + lVar9) * 4);
          dVar1 = exp((double)*(float *)((long)&(((_Vector_base<float,_std::allocator<float>_> *)
                                                 local_60.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_start)->_M_impl)
                                                .super__Vector_impl_data._M_start +
                                        (iVar14 * (int)uVar2 + lVar9) * 4));
          local_110 = 100.0;
          if ((float)dVar1 <= 100.0) {
            local_110 = (float)dVar1;
          }
          fVar15 = cosf(local_10c);
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[(int)((local_118 * iVar14 + (int)lVar9) * 2)] = fVar15 * local_110;
          fVar15 = sinf(local_10c);
          uVar2 = (ulong)local_118;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[(int)((iVar14 * local_118 + (int)lVar9) * 2 + 1)] = fVar15 * local_110;
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 < (int)local_118);
        uVar6 = (ulong)local_114;
      }
      uVar5 = (uint)uVar2;
      iVar14 = iVar14 + 1;
      uVar4 = (uint)uVar6;
      uVar7 = (int)((int)(uVar6 >> 0x1f) + uVar4) >> 1;
    } while (iVar14 < (int)uVar7);
  }
  if (0 < (int)uVar5) {
    pfVar12 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
    n_pad = (ulong)uVar5;
    in_R9 = (vector<float,_std::allocator<float>_> *)(ulong)uVar7;
    pfVar11 = local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
    uVar2 = 0;
    do {
      if (0 < (int)uVar7) {
        pvVar3 = (vector<float,_std::allocator<float>_> *)0x0;
        pfVar10 = pfVar11;
        do {
          pfVar12[(long)pvVar3 * 2 + -1] = pfVar10[-1];
          pfVar12[(long)pvVar3 * 2] = *pfVar10;
          pvVar3 = (vector<float,_std::allocator<float>_> *)
                   ((long)&(pvVar3->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1);
          pfVar10 = pfVar10 + n_pad * 2;
        } while (in_R9 != pvVar3);
      }
      uVar2 = uVar2 + 1;
      pfVar11 = pfVar11 + 2;
      pfVar12 = pfVar12 + (int)uVar4;
    } while (uVar2 != n_pad);
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&local_a8,(long)(int)(uVar5 * 0x500),(allocator_type *)&local_c0);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_c0,(long)(int)local_118 * 0x500,(allocator_type *)&local_48);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_48,(long)local_11c,(allocator_type *)&local_108);
  if (0 < local_11c) {
    lVar9 = 0;
    do {
      local_e0._M_id._M_thread = (id)0;
      local_108 = (long *)operator_new(0x48);
      *local_108 = (long)&PTR___State_0026bc50;
      *(int *)(local_108 + 1) = (int)lVar9;
      local_108[2] = (long)&local_118;
      local_108[3] = (long)&local_11c;
      local_108[4] = (long)&local_90;
      local_108[5] = (long)&local_114;
      local_108[6] = (long)&local_a8;
      local_108[7] = (long)&local_78;
      local_108[8] = (long)&local_c0;
      std::thread::_M_start_thread(&local_e0,&local_108,0);
      if (local_108 != (long *)0x0) {
        (**(code **)(*local_108 + 8))();
      }
      if (local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9]._M_id._M_thread != 0) {
        std::terminate();
      }
      local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[lVar9]._M_id._M_thread =
           (native_handle_type)local_e0._M_id._M_thread;
      lVar9 = lVar9 + 1;
    } while (lVar9 < local_11c);
    if (0 < local_11c) {
      lVar9 = 0;
      do {
        std::thread::join();
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_11c);
    }
  }
  pvVar3 = local_f0;
  uVar5 = local_e4 + 0x3c0;
  uVar2 = (ulong)uVar5;
  (local_f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (local_f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (local_f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8 = 0;
  local_108 = (long *)0x0;
  uStack_100 = 0;
  fold(&local_a8,(long)(int)uVar5,(int64_t)local_f0,uVar2,n_pad,in_R9);
  fold(&local_c0,(long)(int)uVar5,(int64_t)&local_108,uVar2,n_pad,in_R9);
  pfVar11 = (pvVar3->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar9 = (long)(pvVar3->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar11;
  if (lVar9 == 0) {
    if (local_108 == (long *)0x0) goto LAB_0012ba0e;
  }
  else {
    lVar9 = lVar9 >> 2;
    lVar8 = 0;
    do {
      pfVar11[lVar8] = pfVar11[lVar8] / *(float *)((long)local_108 + lVar8 * 4);
      lVar8 = lVar8 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar8);
  }
  operator_delete(local_108,local_f8 - (long)local_108);
LAB_0012ba0e:
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_48);
  pvVar3 = extraout_RAX;
  if (local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pvVar3 = extraout_RAX_00;
  }
  if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pvVar3 = extraout_RAX_01;
  }
  if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pvVar3 = extraout_RAX_02;
  }
  if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pvVar3 = extraout_RAX_03;
  }
  if ((vector<float,_std::allocator<float>_> *)
      local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (vector<float,_std::allocator<float>_> *)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pvVar3 = extraout_RAX_04;
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
    pvVar3 = extraout_RAX_05;
  }
  return pvVar3;
}

Assistant:

static std::vector<float> embd_to_audio(
        const float * embd,
        const int n_codes,
        const int n_embd,
        const int n_thread) {
    const int n_fft = 1280;
    const int n_hop = 320;
    const int n_win = 1280;
    const int n_pad = (n_win - n_hop)/2;
    const int n_out = (n_codes - 1)*n_hop + n_win;

    std::vector<float> hann(n_fft);

    fill_hann_window(hann.size(), true, hann.data());

    int n_spec = n_embd*n_codes;

    std::vector<float> E (n_spec);
    std::vector<float> S (n_spec);
    std::vector<float> ST(n_spec);

    for (int l = 0; l < n_codes; ++l) {
        for (int k = 0; k < n_embd; ++k) {
            E[k*n_codes + l] = embd[l*n_embd + k];
        }
    }

    for (int k = 0; k < n_embd/2; ++k) {
        for (int l = 0; l < n_codes; ++l) {
            float mag = E[(k           )*n_codes + l];
            float phi = E[(k + n_embd/2)*n_codes + l];

            mag = exp(mag);

            if (mag > 1e2) {
                mag = 1e2;
            }
            S[2*(k*n_codes + l) + 0] = mag*cosf(phi);
            S[2*(k*n_codes + l) + 1] = mag*sinf(phi);
        }
    }

    for (int l = 0; l < n_codes; ++l) {
        for (int k = 0; k < n_embd/2; ++k) {
            ST[l*n_embd + 2*k + 0] = S[2*(k*n_codes + l) + 0];
            ST[l*n_embd + 2*k + 1] = S[2*(k*n_codes + l) + 1];
        }
    }

    std::vector<float> res  (n_codes*n_fft);
    std::vector<float> hann2(n_codes*n_fft);

    std::vector<std::thread> workers(n_thread);
    for (int i = 0; i < n_thread; ++i) {
        workers[i] = std::thread([&, i]() {
            for (int l = i; l < n_codes; l += n_thread) {
                irfft(n_fft, ST.data() + l*n_embd, res.data() + l*n_fft);
                for (int j = 0; j < n_fft; ++j) {
                    res  [l*n_fft + j] *= hann[j];
                    hann2[l*n_fft + j]  = hann[j] * hann[j];
                }
            }
        });
    }
    for (int i = 0; i < n_thread; ++i) {
        workers[i].join();
    }

    std::vector<float> audio;
    std::vector<float> env;

    fold(res,   n_out, n_win, n_hop, n_pad, audio);
    fold(hann2, n_out, n_win, n_hop, n_pad, env); // TODO: can be done once

    for (size_t i = 0; i < audio.size(); ++i) {
        audio[i] /= env[i];
    }

    return audio;
}